

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecode_machine.hpp
# Opt level: O2

void randomx::BytecodeMachine::exe_IMULH_M
               (InstructionByteCode *ibc,int *pc,uint8_t *scratchpad,ProgramConfiguration *config)

{
  uint64_t uVar1;
  
  uVar1 = mulh(*(ibc->field_0).idst,
               *(uint64_t *)
                (scratchpad + (*(int *)&ibc->field_2 + (int)*(ibc->field_1).isrc & ibc->memMask)));
  *(ibc->field_0).idst = uVar1;
  return;
}

Assistant:

static void exe_IMULH_M(RANDOMX_EXE_ARGS) {
			*ibc.idst = mulh(*ibc.idst, load64(getScratchpadAddress(ibc, scratchpad)));
		}